

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_context.c
# Opt level: O0

void destroyContextEGL(_GLFWwindow *window)

{
  _GLFWwindow *window_local;
  
  if (((window->context).client != 0x30001) && ((window->context).egl.client != (void *)0x0)) {
    dlclose((window->context).egl.client);
    (window->context).egl.client = (void *)0x0;
  }
  if ((window->context).egl.surface != (EGLSurface)0x0) {
    (*_glfw.egl.DestroySurface)(_glfw.egl.display,(window->context).egl.surface);
    (window->context).egl.surface = (EGLSurface)0x0;
  }
  if ((window->context).egl.handle != (EGLContext)0x0) {
    (*_glfw.egl.DestroyContext)(_glfw.egl.display,(window->context).egl.handle);
    (window->context).egl.handle = (EGLContext)0x0;
  }
  return;
}

Assistant:

static void destroyContextEGL(_GLFWwindow* window)
{
#if !defined(_GLFW_EGL_STATIC)
#if defined(_GLFW_X11)
    // NOTE: Do not unload libGL.so.1 while the X11 display is still open,
    //       as it will make XCloseDisplay segfault
    if (window->context.client != GLFW_OPENGL_API)
#endif // _GLFW_X11
    {
        if (window->context.egl.client)
        {
            _glfw_dlclose(window->context.egl.client);
            window->context.egl.client = NULL;
        }
    }
#endif

    if (window->context.egl.surface)
    {
        eglDestroySurface(_glfw.egl.display, window->context.egl.surface);
        window->context.egl.surface = EGL_NO_SURFACE;
    }

    if (window->context.egl.handle)
    {
        eglDestroyContext(_glfw.egl.display, window->context.egl.handle);
        window->context.egl.handle = EGL_NO_CONTEXT;
    }
}